

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O0

ZyanStatus
ZydisFormatterATTPrintRegister
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context,
          ZydisRegister reg)

{
  ZydisShortString *source;
  ZydisShortString *str;
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZydisRegister reg_local;
  ZydisFormatterContext *context_local;
  ZydisFormatterBuffer *buffer_local;
  ZydisFormatter *formatter_local;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x15f,
                  "ZyanStatus ZydisFormatterATTPrintRegister(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisRegister)"
                 );
  }
  if (buffer != (ZydisFormatterBuffer *)0x0) {
    if (context != (ZydisFormatterContext *)0x0) {
      if (buffer->is_token_list == '\0') {
        formatter_local._4_4_ = ZydisStringAppendShort(&buffer->string,&STR_REGISTER);
      }
      else {
        formatter_local._4_4_ =
             ZydisFormatterBufferAppendPredefined(buffer,(ZydisPredefinedToken *)&TOK_DATA_REGISTER)
        ;
      }
      if ((formatter_local._4_4_ & 0x80000000) == 0) {
        source = ZydisRegisterGetStringWrapped(reg);
        if (source == (ZydisShortString *)0x0) {
          formatter_local._4_4_ =
               ZydisStringAppendShortCase
                         (&buffer->string,&STR_INVALID_REG,formatter->case_registers);
        }
        else {
          formatter_local._4_4_ =
               ZydisStringAppendShortCase(&buffer->string,source,formatter->case_registers);
        }
      }
      return formatter_local._4_4_;
    }
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x161,
                  "ZyanStatus ZydisFormatterATTPrintRegister(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisRegister)"
                 );
  }
  __assert_fail("buffer",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                ,0x160,
                "ZyanStatus ZydisFormatterATTPrintRegister(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisRegister)"
               );
}

Assistant:

ZyanStatus ZydisFormatterATTPrintRegister(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context, ZydisRegister reg)
{
    ZYAN_UNUSED(context);

    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    ZYDIS_BUFFER_APPEND(buffer, REGISTER);
    const ZydisShortString* str = ZydisRegisterGetStringWrapped(reg);
    if (!str)
    {
        return ZydisStringAppendShortCase(&buffer->string, &STR_INVALID_REG,
            formatter->case_registers);
    }
    return ZydisStringAppendShortCase(&buffer->string, str, formatter->case_registers);
}